

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

int Vec_WecSizeUsedLimits(Vec_Wec_t *p,int iStart,int iStop)

{
  Vec_Int_t *pVVar1;
  int Counter;
  int iVar2;
  
  iVar2 = 0;
  for (; iStart < iStop; iStart = iStart + 1) {
    pVVar1 = Vec_WecEntry(p,iStart);
    iVar2 = iVar2 + (uint)(0 < pVVar1->nSize);
  }
  return iVar2;
}

Assistant:

static inline int Vec_WecSizeUsedLimits( Vec_Wec_t * p, int iStart, int iStop )
{
    Vec_Int_t * vVec;
    int i, Counter = 0;
    Vec_WecForEachLevelStartStop( p, vVec, i, iStart, iStop )
        Counter += (int)(Vec_IntSize(vVec) > 0);
    return Counter;
}